

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int debug_getupvalue(lua_State *L,int get)

{
  int32_t n;
  int iVar1;
  char *str;
  
  n = lj_lib_checkint(L,2);
  lj_lib_checkfunc(L,1);
  if (get == 0) {
    str = lua_setupvalue(L,1,n);
  }
  else {
    str = lua_getupvalue(L,1,n);
  }
  if (str == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    lua_pushstring(L,str);
    if (get == 0) {
      iVar1 = 1;
    }
    else {
      *L->top = L->top[-2];
      L->top = L->top + 1;
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

static int debug_getupvalue(lua_State *L, int get)
{
  int32_t n = lj_lib_checkint(L, 2);
  const char *name;
  lj_lib_checkfunc(L, 1);
  name = get ? lua_getupvalue(L, 1, n) : lua_setupvalue(L, 1, n);
  if (name) {
    lua_pushstring(L, name);
    if (!get) return 1;
    copyTV(L, L->top, L->top-2);
    L->top++;
    return 2;
  }
  return 0;
}